

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQObject __thiscall SQFuncState::CreateString(SQFuncState *this,SQChar *s,SQInteger len)

{
  SQTable *this_00;
  SQString *x;
  SQObject SVar1;
  SQObjectPtr local_50;
  undefined1 auStack_40 [8];
  SQObjectPtr ns;
  SQInteger len_local;
  SQChar *s_local;
  SQFuncState *this_local;
  
  ns.super_SQObject._unVal.nInteger = len;
  x = SQString::Create(this->_sharedstate,s,len);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)auStack_40,x);
  this_00 = (this->_strings).super_SQObject._unVal.pTable;
  ::SQObjectPtr::SQObjectPtr(&local_50,1);
  SQTable::NewSlot(this_00,(SQObjectPtr *)auStack_40,&local_50);
  ::SQObjectPtr::~SQObjectPtr(&local_50);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)auStack_40);
  SVar1._0_8_ = (ulong)auStack_40 & 0xffffffff;
  SVar1._unVal = (SQObjectValue)ns.super_SQObject._0_8_;
  return SVar1;
}

Assistant:

SQObject SQFuncState::CreateString(const SQChar *s,SQInteger len)
{
    SQObjectPtr ns(SQString::Create(_sharedstate,s,len));
    _table(_strings)->NewSlot(ns,(SQInteger)1);
    return ns;
}